

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::injectBuffersForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_color _Var4;
  uint uVar5;
  ulong __new_size;
  cl_int cVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  mapped_type_conflict *pmVar13;
  CLdispatchX *pCVar14;
  void *pvVar15;
  undefined4 extraout_XMM0_Da;
  float __x;
  float __x_00;
  float __x_01;
  undefined4 extraout_XMM0_Db;
  void *allocation;
  cl_mem memobj;
  cl_command_queue local_440;
  CBufferInfoMap *local_438;
  cl_platform_id local_430;
  CSVMAllocInfoMap *local_428;
  CUSMAllocInfoMap *local_420;
  vector<char,_std::allocator<char>_> transferBuf;
  cl_kernel kernel_local;
  uint64_t local_3d8;
  CMemAllocNumberMap *local_3d0;
  _Rb_tree_node_base *local_3c8;
  cl_int error;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string fileName;
  ifstream is;
  int aiStack_320 [122];
  char tmpStr [256];
  
  local_440 = command_queue;
  kernel_local = kernel;
  local_3d8 = enqueueCounter;
  std::mutex::lock(&this->m_Mutex);
  local_430 = getPlatform(this,kernel);
  transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prefix.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&is,sc_DumpDirectoryName,(allocator *)tmpStr);
  OS::Services_Common::GetDumpDirectoryNameWithoutPid
            (&(this->m_OS).super_Services_Common,(string *)&is,&prefix);
  std::__cxx11::string::~string((string *)&is);
  std::__cxx11::string::append((char *)&prefix);
  pmVar7 = std::
           map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
           ::operator[](&this->m_KernelArgMemMap,&kernel_local);
  p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_420 = &this->m_USMAllocInfoMap;
  p_Var1 = &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
  local_428 = &this->m_SVMAllocInfoMap;
  p_Var2 = &(this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
  local_438 = &this->m_BufferInfoMap;
  p_Var3 = &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  local_3d0 = &this->m_MemAllocNumberMap;
  do {
    if (p_Var8 == local_3c8) {
      std::__cxx11::string::~string((string *)&prefix);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&transferBuf.super__Vector_base<char,_std::allocator<char>_>);
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
      return;
    }
    _Var4 = p_Var8[1]._M_color;
    allocation = p_Var8[1]._M_parent;
    memobj = (cl_mem)allocation;
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    iVar9 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::_Select1st<std::pair<const_void_*const,_unsigned_long>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
            ::find(&local_420->_M_t,&allocation);
    if ((_Rb_tree_header *)iVar9._M_node != p_Var1) goto LAB_0016c986;
    iVar9 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::_Select1st<std::pair<const_void_*const,_unsigned_long>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
            ::find(&local_428->_M_t,&allocation);
    if ((_Rb_tree_header *)iVar9._M_node != p_Var2) goto LAB_0016c986;
    iVar10 = std::
             _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
             ::find(&local_438->_M_t,&memobj);
    if ((_Rb_tree_header *)iVar10._M_node != p_Var3) {
LAB_0016c986:
      _is = (pointer)memobj;
      pmVar11 = std::
                map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                ::operator[](local_3d0,(key_type *)&is);
      uVar5 = *pmVar11;
      std::__cxx11::string::string((string *)&fileName,(string *)&prefix);
      snprintf(tmpStr,0x100,"%04u",local_3d8);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      getShortKernelName_abi_cxx11_((string *)&is,this,kernel_local);
      std::__cxx11::string::append((string *)&fileName);
      std::__cxx11::string::~string((string *)&is);
      snprintf(tmpStr,0x100,"%u",(ulong)_Var4);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      snprintf(tmpStr,0x100,"%04u",(ulong)uVar5);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      std::ifstream::ifstream((string *)&is);
      std::ifstream::open((char *)&is,(_Ios_Openmode)fileName._M_dataplus._M_p);
      if (*(int *)((long)aiStack_320 + *(long *)(_is + -0x18)) == 0) {
        std::operator+(&local_380,"Injecting buffer file: ",&fileName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                       &local_380,"\n");
        log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::~string((string *)&local_380);
        std::istream::seekg((long)&is,_S_beg);
        uVar12 = std::istream::tellg();
        std::istream::seekg((long)&is,_S_beg);
        iVar9 = std::
                _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::_Select1st<std::pair<const_void_*const,_unsigned_long>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                ::find(&local_420->_M_t,&allocation);
        if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
          iVar9 = std::
                  _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::_Select1st<std::pair<const_void_*const,_unsigned_long>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                  ::find(&local_428->_M_t,&allocation);
          if ((_Rb_tree_header *)iVar9._M_node == p_Var2) {
            iVar10 = std::
                     _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                     ::find(&local_438->_M_t,&memobj);
            if ((_Rb_tree_header *)iVar10._M_node != p_Var3) {
              pmVar13 = std::
                        map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                        ::operator[](local_438,&memobj);
              if (*pmVar13 < uVar12) {
                logf(this,__x_01);
              }
              else {
                error = 0;
                pvVar15 = (*(this->m_Dispatch).clEnqueueMapBuffer)
                                    (local_440,memobj,1,4,0,*pmVar13,0,(cl_event *)0x0,
                                     (cl_event *)0x0,&error);
                if (error == 0) {
                  std::istream::read((char *)&is,(long)pvVar15);
                  (*(this->m_Dispatch).clEnqueueUnmapMemObject)
                            (local_440,memobj,pvVar15,0,(cl_event *)0x0,(cl_event *)0x0);
                }
              }
            }
          }
          else {
            pmVar13 = std::
                      map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                      ::operator[](local_428,&allocation);
            if (*pmVar13 < uVar12) {
              logf(this,__x_00);
            }
            else {
              cVar6 = (*(this->m_Dispatch).clEnqueueSVMMap)
                                (local_440,1,4,allocation,*pmVar13,0,(cl_event *)0x0,(cl_event *)0x0
                                );
              if (cVar6 == 0) {
                std::istream::read((char *)&is,(long)allocation);
                (*(this->m_Dispatch).clEnqueueSVMUnmap)
                          (local_440,allocation,0,(cl_event *)0x0,(cl_event *)0x0);
              }
            }
          }
        }
        else {
          pmVar13 = std::
                    map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                    ::operator[](local_420,&allocation);
          __new_size = *pmVar13;
          if (__new_size < uVar12) {
            logf(this,__x);
          }
          else {
            pCVar14 = dispatchX(this,local_430);
            if (pCVar14->clEnqueueMemcpyINTEL ==
                (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) {
              std::__cxx11::string::string
                        ((string *)&error,"clEnqueueMemcpyINTEL",(allocator *)&local_380);
              getExtensionFunctionAddress(this,local_430,(string *)&error);
              std::__cxx11::string::~string((string *)&error);
            }
            if ((ulong)((long)transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) < __new_size) {
              std::vector<char,_std::allocator<char>_>::resize(&transferBuf,__new_size);
            }
            pCVar14 = dispatchX(this,local_430);
            if ((pCVar14->clEnqueueMemcpyINTEL !=
                 (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                  *)0x0) &&
               (__new_size <=
                (ulong)((long)transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start))) {
              std::istream::read((char *)&is,
                                 (long)transferBuf.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
              (*pCVar14->clEnqueueMemcpyINTEL)
                        (local_440,1,allocation,
                         transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,__new_size,0,(cl_event *)0x0,
                         (cl_event *)0x0);
            }
          }
        }
      }
      std::ifstream::~ifstream((string *)&is);
      std::__cxx11::string::~string((string *)&fileName);
    }
  } while( true );
}

Assistant:

void CLIntercept::injectBuffersForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(kernel);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        void*   allocation = (void*)(*i).second;
        cl_mem  memobj = (cl_mem)allocation;

        ++i;

        if( ( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() ) ||
            ( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() ) ||
            ( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() ) )
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the buffer number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Buffer_";
                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".bin";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting buffer file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                if( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() )
                {
                    size_t size = m_USMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: USM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        if( dispatchX(platform).clEnqueueMemcpyINTEL == NULL )
                        {
                            getExtensionFunctionAddress(
                                platform,
                                "clEnqueueMemcpyINTEL" );
                        }
                        if( transferBuf.size() < size )
                        {
                            transferBuf.resize(size);
                        }

                        const auto& dispatchX = this->dispatchX(platform);
                        if( dispatchX.clEnqueueMemcpyINTEL &&
                            transferBuf.size() >= size )
                        {
                            is.read( transferBuf.data(), size );

                            dispatchX.clEnqueueMemcpyINTEL(
                                command_queue,
                                CL_TRUE,
                                allocation,
                                transferBuf.data(),
                                size,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() )
                {
                    size_t size = m_SVMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: SVM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = dispatch().clEnqueueSVMMap(
                            command_queue,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            allocation,
                            size,
                            0,
                            NULL,
                            NULL );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)allocation, size );

                            dispatch().clEnqueueSVMUnmap(
                                command_queue,
                                allocation,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
                {
                    size_t size = m_BufferInfoMap[ memobj ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: buffer size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = CL_SUCCESS;
                        void*   ptr = dispatch().clEnqueueMapBuffer(
                            command_queue,
                            memobj,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            0,
                            size,
                            0,
                            NULL,
                            NULL,
                            &error );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)ptr, size );

                            dispatch().clEnqueueUnmapMemObject(
                                command_queue,
                                memobj,
                                ptr,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
            }
        }
    }
}